

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixCaseBlocks
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool
               *blockContentGenerator)

{
  Node *ptr;
  StorageQualifier *this;
  TestNode *node;
  TestContext *testCtx;
  LayoutQualifier *this_00;
  InterfaceBlock *this_01;
  undefined1 local_c9;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_b0;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_a0;
  undefined1 local_90 [8];
  Layout layout;
  bool addOpaqueCases;
  TestCaseGroup *blockGroup;
  SharedPtr subStructure;
  undefined1 local_58 [4];
  int childNdx;
  SharedPtr uniform;
  undefined1 local_38 [8];
  SharedPtr defaultBlock;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool *blockContentGenerator_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  defaultBlock.m_state = (SharedPtrStateBase *)blockContentGenerator;
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)ptr,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_38,ptr);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,(SharedPtr *)local_38,STORAGE_UNIFORM)
  ;
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_58,(Node *)this);
  for (subStructure.m_state._4_4_ = 0; subStructure.m_state._4_4_ < 7;
      subStructure.m_state._4_4_ = subStructure.m_state._4_4_ + 1) {
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&blockGroup,
              (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_58);
    node = (TestNode *)operator_new(0x70);
    testCtx = Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,
               generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].name,
               generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].description);
    local_c9 = FORMATLAYOUT_RGBA32F >> 0x18;
    if ((generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].
         extendedBasicTypeCases & 1U) != 0) {
      local_c9 = generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].block ^ 0xff;
    }
    layout.format._3_1_ = local_c9 & 1;
    unique0x100003fe = node;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
    if (generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].order !=
        MATRIXORDER_LAST) {
      glu::Layout::Layout((Layout *)local_90,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      layout.offset = generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].order;
      this_00 = (LayoutQualifier *)operator_new(0x38);
      ResourceDefinition::LayoutQualifier::LayoutQualifier
                (this_00,(SharedPtr *)&blockGroup,(Layout *)local_90);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_a0,(Node *)this_00);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&blockGroup,&local_a0);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&local_a0);
    }
    if ((generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].block & 1U) != 0) {
      this_01 = (InterfaceBlock *)operator_new(0x28);
      ResourceDefinition::InterfaceBlock::InterfaceBlock
                (this_01,(SharedPtr *)&blockGroup,
                 (bool)(generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].
                        namedBlock & 1));
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&local_b0,(Node *)this_01);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::operator=((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&blockGroup,&local_b0);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&local_b0);
    }
    (*(code *)defaultBlock.m_state)
              (context,&blockGroup,stack0xffffffffffffff88,
               generateUniformMatrixCaseBlocks::children[subStructure.m_state._4_4_].
               extendedBasicTypeCases & 1,layout.format._3_1_ & 1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&blockGroup);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_58);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateUniformMatrixCaseBlocks (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, bool, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				block;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "default_block",				"Default block",			false,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block",				"Named uniform block",		true,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr uniform		(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_UNIFORM));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	subStructure	= uniform;
		tcu::TestCaseGroup* const			blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), children[childNdx].name, children[childNdx].description);
		const bool							addOpaqueCases	= children[childNdx].extendedBasicTypeCases && !children[childNdx].block;

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
		}

		if (children[childNdx].block)
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(subStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, subStructure, blockGroup, children[childNdx].extendedBasicTypeCases, addOpaqueCases);
	}
}